

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmJsonEncode(jx9_value *pIn,json_private_data *pData)

{
  char cVar1;
  uint uVar2;
  SyBlob *pBlob;
  int iVar3;
  sxi32 sVar4;
  undefined8 in_RAX;
  sxu32 sVar5;
  char *pcVar6;
  int *pData_00;
  char *pcVar7;
  int c;
  int nByte;
  
  pBlob = pData->pOut;
  if ((pIn->iFlags & 0x120U) != 0) {
LAB_001190ef:
    pcVar6 = "null";
    sVar5 = 4;
LAB_00119163:
    sVar4 = SyBlobAppend(pBlob,pcVar6,sVar5);
    return sVar4;
  }
  if ((pIn->iFlags & 8U) != 0) {
    iVar3 = jx9_value_to_bool(pIn);
    pcVar6 = "true";
    if (iVar3 == 0) {
      pcVar6 = "false";
    }
    sVar5 = iVar3 == 0 | 4;
    goto LAB_00119163;
  }
  _c = in_RAX;
  iVar3 = jx9_value_is_numeric(pIn);
  uVar2 = pIn->iFlags;
  if (iVar3 == 0) {
    if ((uVar2 & 1) == 0) {
      if ((uVar2 & 0x40) != 0) {
        pData->isFirst = 1;
        if ((*(byte *)((pIn->x).iVal + 0x40) & 1) == 0) {
          SyBlobAppend(pBlob,"[",1);
          jx9_array_walk(pIn,VmJsonArrayEncode,pData);
          pcVar6 = "]";
        }
        else {
          SyBlobAppend(pBlob,"{",1);
          jx9_array_walk(pIn,VmJsonObjectEncode,pData);
          pcVar6 = "}";
        }
        sVar5 = 1;
        goto LAB_00119163;
      }
      goto LAB_001190ef;
    }
  }
  else if ((uVar2 & 1) == 0) {
    pcVar6 = jx9_value_to_string(pIn,&nByte);
    sVar5 = nByte;
    goto LAB_00119240;
  }
  pcVar6 = jx9_value_to_string(pIn,&nByte);
  pcVar7 = pcVar6 + nByte;
  pData_00 = (int *)"\"";
  while (SyBlobAppend(pBlob,pData_00,1), pcVar6 < pcVar7) {
    cVar1 = *pcVar6;
    pcVar6 = pcVar6 + 1;
    _c = CONCAT44(nByte,(int)cVar1);
    if ((cVar1 == '\\') || (pData_00 = &c, cVar1 == '\"')) {
      SyBlobAppend(pBlob,"\\",1);
      pData_00 = &c;
    }
  }
  pcVar6 = "\"";
  sVar5 = 1;
LAB_00119240:
  sVar4 = SyBlobAppend(pBlob,pcVar6,sVar5);
  return sVar4;
}

Assistant:

static sxi32 VmJsonEncode(
	jx9_value *pIn,          /* Encode this value */
	json_private_data *pData /* Context data */
	){
		SyBlob *pOut = pData->pOut;
		int nByte;
		if( jx9_value_is_null(pIn) || jx9_value_is_resource(pIn)){
			/* null */
			SyBlobAppend(pOut, "null", sizeof("null")-1);
		}else if( jx9_value_is_bool(pIn) ){
			int iBool = jx9_value_to_bool(pIn);
			sxu32 iLen;
			/* true/false */
			iLen = iBool ? sizeof("true") : sizeof("false");
			SyBlobAppend(pOut, iBool ? "true" : "false", iLen-1);
		}else if(  jx9_value_is_numeric(pIn) && !jx9_value_is_string(pIn) ){
			const char *zNum;
			/* Get a string representation of the number */
			zNum = jx9_value_to_string(pIn, &nByte);
			SyBlobAppend(pOut,zNum,nByte);
		}else if( jx9_value_is_string(pIn) ){
				const char *zIn, *zEnd;
				int c;
				/* Encode the string */
				zIn = jx9_value_to_string(pIn, &nByte);
				zEnd = &zIn[nByte];
				/* Append the double quote */
				SyBlobAppend(pOut,"\"", sizeof(char));
				for(;;){
					if( zIn >= zEnd ){
						/* No more input to process */
						break;
					}
					c = zIn[0];
					/* Advance the stream cursor */
					zIn++;
					if( c == '"' || c == '\\' ){
						/* Unescape the character */
						SyBlobAppend(pOut,"\\", sizeof(char));
					}
					/* Append character verbatim */
					SyBlobAppend(pOut,(const char *)&c,sizeof(char));
				}
				/* Append the double quote */
				SyBlobAppend(pOut,"\"",sizeof(char));
		}else if( jx9_value_is_json_array(pIn) ){
			/* Encode the array/object */
			pData->isFirst = 1;
			if( jx9_value_is_json_object(pIn) ){
				/* Encode the object instance */
				pData->isFirst = 1;
				/* Append the curly braces */
				SyBlobAppend(pOut, "{",sizeof(char));
				/* Iterate throw object attribute */
				jx9_array_walk(pIn,VmJsonObjectEncode, pData);
				/* Append the closing curly braces  */
				SyBlobAppend(pOut, "}",sizeof(char));
			}else{
				/* Append the square bracket or curly braces */
				SyBlobAppend(pOut,"[",sizeof(char));
				/* Iterate throw array entries */
				jx9_array_walk(pIn, VmJsonArrayEncode, pData);
				/* Append the closing square bracket or curly braces */
				SyBlobAppend(pOut,"]",sizeof(char));
			}
		}else{
			/* Can't happen */
			SyBlobAppend(pOut,"null",sizeof("null")-1);
		}
		/* All done */
		return JX9_OK;
}